

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

int __thiscall
cmCPackIFWPackage::ConfigureFromGroup(cmCPackIFWPackage *this,cmCPackComponentGroup *group)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmCPackLog *this_01;
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  string local_1d0;
  string prefix;
  ostringstream cmCPackLog_msg;
  
  if (group == (cmCPackComponentGroup *)0x0) {
    iVar1 = 0;
  }
  else {
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_1d0,&group->Name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,"CPACK_IFW_COMPONENT_GROUP_",&local_1d0);
    std::operator+(&prefix,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cmCPackLog_msg,"_");
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::_M_assign((string *)&this->Description);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"VERSION");
    pcVar2 = GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_VERSION",(allocator *)&local_1d0);
      GetOption(this,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::assign((char *)&this->Version);
    }
    else {
      std::__cxx11::string::assign((char *)&this->Version);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"SCRIPT");
    pcVar2 = GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->Script);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"LICENSES");
    pcVar2 = GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar2 != (char *)0x0) {
      this_00 = &this->Licenses;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(this_00);
      std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar2,(allocator *)&local_1d0);
      cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,this_00,false);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if ((*(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x20U) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,(string *)&prefix);
        poVar3 = std::operator<<(poVar3,"LICENSES");
        poVar3 = std::operator<<(poVar3," should contain pairs of <display_name> and <file_path>.");
        std::endl<char,std::char_traits<char>>(poVar3);
        if (this->Generator != (cmCPackIFWGenerator *)0x0) {
          this_01 = (this->Generator->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(this_01,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0x179,local_1d0._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_1d0);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(this_00);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"PRIORITY");
    pcVar2 = GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->SortingPriority);
    }
    std::__cxx11::string::~string((string *)&prefix);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
cmCPackIFWPackage::ConfigureFromGroup(cmCPackComponentGroup *group)
{
  if(!group) return 0;

  // Restore defaul configuration
  DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_GROUP_"
    + cmsys::SystemTools::UpperCase(group->Name)
    + "_";

  DisplayName = group->DisplayName;
  Description = group->Description;

  // Version
  if(const char* optVERSION = GetOption(prefix + "VERSION"))
    {
    Version = optVERSION;
    }
  else if(const char* optPACKAGE_VERSION =
          GetOption("CPACK_PACKAGE_VERSION"))
    {
    Version = optPACKAGE_VERSION;
    }
  else
    {
    Version = "1.0.0";
    }

  // Script
  if (const char* option = GetOption(prefix + "SCRIPT"))
    {
    Script = option;
    }

  // Licenses
  if (const char* option = this->GetOption(prefix + "LICENSES"))
    {
    Licenses.clear();
    cmSystemTools::ExpandListArgument( option, Licenses );
    if ( Licenses.size() % 2 != 0 )
      {
      cmCPackLogger(cmCPackLog::LOG_WARNING, prefix << "LICENSES"
        << " should contain pairs of <display_name> and <file_path>."
        << std::endl);
      Licenses.clear();
      }
    }

  // Priority
  if(const char* option = this->GetOption(prefix + "PRIORITY"))
    {
    SortingPriority = option;
    }

  return 1;
}